

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O3

XMLAttDef * __thiscall
xercesc_4_0::DTDScanner::scanAttDef(DTDScanner *this,DTDElementDecl *parentElem,XMLBuffer *bufToUse)

{
  short sVar1;
  short sVar2;
  uint uVar3;
  DefAttTypes DVar4;
  ReaderMgr *pRVar5;
  XMLScanner *pXVar6;
  XMLValidator *this_00;
  XMLReader *this_01;
  DocTypeHandler *pDVar7;
  bool bVar8;
  int iVar9;
  DTDAttDef *pDVar10;
  XMLCh *text2;
  DTDAttDef *this_02;
  undefined4 extraout_var;
  short *psVar11;
  BaseRefVectorOf<char16_t> *this_03;
  char16_t *pcVar12;
  undefined4 extraout_var_01;
  XMLCh *pXVar13;
  short *psVar14;
  long lVar15;
  XMLCh fgDefault [8];
  XMLCh fgPreserve [9];
  wchar16 local_58 [20];
  undefined4 extraout_var_00;
  
  checkForPERef(this,false,true);
  pRVar5 = this->fReaderMgr;
  bufToUse->fIndex = 0;
  bVar8 = XMLReader::getName(pRVar5->fCurReader,bufToUse,false);
  if (!bVar8) {
    XMLScanner::emitError(this->fScanner,ExpectedAttrName);
    return (XMLAttDef *)0x0;
  }
  pXVar13 = bufToUse->fBuffer;
  pXVar13[bufToUse->fIndex] = L'\0';
  pDVar10 = DTDElementDecl::getAttDef(parentElem,pXVar13);
  if (pDVar10 == (DTDAttDef *)0x0) {
    this_02 = (DTDAttDef *)XMemory::operator_new(0x48,this->fGrammarPoolMemoryManager);
    pXVar13 = bufToUse->fBuffer;
    pXVar13[bufToUse->fIndex] = L'\0';
    DTDAttDef::DTDAttDef(this_02,pXVar13,AttTypes_Min,Implied,this->fGrammarPoolMemoryManager);
    uVar3 = this->fNextAttrId;
    this->fNextAttrId = uVar3 + 1;
    (this_02->super_XMLAttDef).fId = (ulong)uVar3;
    (this_02->super_XMLAttDef).fExternalAttribute =
         this->fDocTypeReaderId != this->fReaderMgr->fCurReader->fReaderNum;
    DTDElementDecl::addAttDef(parentElem,this_02);
    pDVar10 = this->fDumAttDef;
  }
  else {
    pXVar6 = this->fScanner;
    pXVar13 = bufToUse->fBuffer;
    pXVar13[bufToUse->fIndex] = L'\0';
    text2 = QName::getRawName((parentElem->super_XMLElementDecl).fElementName);
    XMLScanner::emitError(pXVar6,AttListAlreadyExists,pXVar13,text2,(XMLCh *)0x0,(XMLCh *)0x0);
    pDVar10 = this->fDumAttDef;
    if (pDVar10 == (DTDAttDef *)0x0) {
      pDVar10 = (DTDAttDef *)XMemory::operator_new(0x48,this->fMemoryManager);
      DTDAttDef::DTDAttDef(pDVar10,this->fMemoryManager);
      this->fDumAttDef = pDVar10;
      uVar3 = this->fNextAttrId;
      this->fNextAttrId = uVar3 + 1;
      (pDVar10->super_XMLAttDef).fId = (ulong)uVar3;
    }
    pXVar13 = bufToUse->fBuffer;
    pXVar13[bufToUse->fIndex] = L'\0';
    DTDAttDef::setName(pDVar10,pXVar13);
    pDVar10 = this->fDumAttDef;
    this_02 = pDVar10;
  }
  bVar8 = checkForPERef(this,false,true);
  if (!bVar8) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  bVar8 = XMLReader::skippedString(this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgCDATAString);
  if (bVar8) {
    (this_02->super_XMLAttDef).fType = AttTypes_Min;
  }
  else {
    bVar8 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"ID");
    this_01 = this->fReaderMgr->fCurReader;
    if (bVar8) {
      bVar8 = XMLReader::skippedString(this_01,L"REF");
      if (bVar8) {
        bVar8 = ReaderMgr::skippedChar(this->fReaderMgr,L'S');
        if (bVar8) {
          (this_02->super_XMLAttDef).fType = IDRefs;
        }
        else {
          (this_02->super_XMLAttDef).fType = IDRef;
        }
      }
      else {
        (this_02->super_XMLAttDef).fType = ID;
      }
    }
    else {
      bVar8 = XMLReader::skippedString(this_01,(XMLCh *)XMLUni::fgEntitString);
      if (bVar8) {
        bVar8 = ReaderMgr::skippedChar(this->fReaderMgr,L'Y');
        if (bVar8) {
          (this_02->super_XMLAttDef).fType = Entity;
        }
        else {
          bVar8 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"IES");
          if (!bVar8) {
LAB_00300d55:
            pXVar6 = this->fScanner;
            iVar9 = (*(this_02->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])
                              (this_02);
            pXVar13 = QName::getRawName((parentElem->super_XMLElementDecl).fElementName);
            XMLScanner::emitError
                      (pXVar6,ExpectedAttributeType,(XMLCh *)CONCAT44(extraout_var_01,iVar9),pXVar13
                       ,(XMLCh *)0x0,(XMLCh *)0x0);
            return (XMLAttDef *)0x0;
          }
          (this_02->super_XMLAttDef).fType = Entities;
        }
      }
      else {
        bVar8 = XMLReader::skippedString
                          (this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgNmTokenString);
        if (bVar8) {
          bVar8 = ReaderMgr::skippedChar(this->fReaderMgr,L'S');
          if (bVar8) {
            (this_02->super_XMLAttDef).fType = NmTokens;
          }
          else {
            (this_02->super_XMLAttDef).fType = NmToken;
          }
        }
        else {
          bVar8 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"NOTATION");
          if (bVar8) {
            bVar8 = checkForPERef(this,false,true);
            if (!bVar8) {
              XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
            }
            (this_02->super_XMLAttDef).fType = Notation;
            bVar8 = true;
          }
          else {
            bVar8 = ReaderMgr::skippedChar(this->fReaderMgr,L'(');
            if (!bVar8) goto LAB_00300d55;
            (this_02->super_XMLAttDef).fType = Enumeration;
            bVar8 = false;
          }
          bVar8 = scanEnumeration(this,this_02,bufToUse,bVar8);
          if (!bVar8) {
            return (XMLAttDef *)0x0;
          }
          pXVar13 = bufToUse->fBuffer;
          pXVar13[bufToUse->fIndex] = L'\0';
          XMLAttDef::setEnumeration(&this_02->super_XMLAttDef,pXVar13);
        }
      }
    }
  }
  bVar8 = checkForPERef(this,false,true);
  if (!bVar8) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  scanDefaultDecl(this,this_02);
  if (this->fScanner->fValScheme != Val_Always) goto LAB_00300e59;
  if ((((this_02->super_XMLAttDef).fType == ID) &&
      (DVar4 = (this_02->super_XMLAttDef).fDefaultType, DVar4 != Required)) && (DVar4 != Implied)) {
    this_00 = this->fScanner->fValidator;
    iVar9 = (*(this_02->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(this_02);
    XMLValidator::emitError
              (this_00,BadIDAttrDefType,(XMLCh *)CONCAT44(extraout_var,iVar9),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0);
  }
  iVar9 = (*(this_02->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(this_02);
  psVar11 = (short *)CONCAT44(extraout_var_00,iVar9);
  psVar14 = &DAT_00366ca0;
  if (psVar11 != (short *)0x0) {
    do {
      sVar1 = *psVar11;
      if (sVar1 == 0) goto LAB_00300b69;
      psVar11 = psVar11 + 1;
      sVar2 = *psVar14;
      psVar14 = psVar14 + 1;
    } while (sVar1 == sVar2);
    goto LAB_00300e59;
  }
LAB_00300b69:
  if (*psVar14 != 0) goto LAB_00300e59;
  builtin_memcpy(local_58 + 8,L"preserve",0x12);
  builtin_memcpy(local_58,L"default",0x10);
  if ((this_02->super_XMLAttDef).fType == Enumeration) {
    this_03 = XMLString::tokenizeString
                        ((this_02->super_XMLAttDef).fEnumeration,this->fMemoryManager);
    if (this_03->fCurCount == 2) {
      pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_03,0);
      bVar8 = XMLString::equals(pcVar12,local_58);
      if (bVar8) {
        pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_03,1);
        bVar8 = XMLString::equals(pcVar12,local_58 + 8);
        if (bVar8) goto LAB_00300e2e;
      }
      pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_03,1);
      bVar8 = XMLString::equals(pcVar12,local_58);
      if (bVar8) {
        pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_03,0);
        bVar8 = XMLString::equals(pcVar12,local_58 + 8);
        (*this_03->_vptr_BaseRefVectorOf[1])(this_03);
        if (bVar8) goto LAB_00300e59;
        goto LAB_00300e44;
      }
    }
    else if (this_03->fCurCount == 1) {
      pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_03,0);
      if (pcVar12 != local_58) {
        if (pcVar12 != (char16_t *)0x0) {
          lVar15 = 0;
          do {
            psVar14 = (short *)((long)pcVar12 + lVar15);
            if (*psVar14 == 0) {
              if (*(short *)((long)local_58 + lVar15) == 0) goto LAB_00300e2e;
              break;
            }
            psVar11 = (short *)((long)local_58 + lVar15);
            lVar15 = lVar15 + 2;
          } while (*psVar14 == *psVar11);
        }
        pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_03,0);
        bVar8 = XMLString::equals(pcVar12,local_58 + 8);
        if (!bVar8) goto LAB_00300e3a;
      }
LAB_00300e2e:
      (*this_03->_vptr_BaseRefVectorOf[1])(this_03);
      goto LAB_00300e59;
    }
LAB_00300e3a:
    (*this_03->_vptr_BaseRefVectorOf[1])(this_03);
  }
LAB_00300e44:
  XMLValidator::emitError(this->fScanner->fValidator,IllegalXMLSpace);
LAB_00300e59:
  pDVar7 = this->fDocTypeHandler;
  if (pDVar7 != (DocTypeHandler *)0x0) {
    (*pDVar7->_vptr_DocTypeHandler[2])(pDVar7,parentElem,this_02,(ulong)(this_02 == pDVar10));
  }
  return &this_02->super_XMLAttDef;
}

Assistant:

XMLAttDef*
DTDScanner::scanAttDef(DTDElementDecl& parentElem, XMLBuffer& bufToUse)
{
    // Check for PE ref or optional whitespace
    checkForPERef(false, true);

    // Get the name of the attribute
    if (!fReaderMgr->getName(bufToUse))
    {
        fScanner->emitError(XMLErrs::ExpectedAttrName);
        return 0;
    }

    //
    //  Look up this attribute in the parent element's attribute list. If
    //  it already exists, then use the dummy.
    //
    DTDAttDef* decl = parentElem.getAttDef(bufToUse.getRawBuffer());
    if (decl)
    {
        // It already exists, so put out a warning
        fScanner->emitError
        (
            XMLErrs::AttListAlreadyExists
            , bufToUse.getRawBuffer()
            , parentElem.getFullName()
        );

        // Use the dummy decl to parse into and set its name to the name we got
        if (!fDumAttDef)
        {
            fDumAttDef = new (fMemoryManager) DTDAttDef(fMemoryManager);
            fDumAttDef->setId(fNextAttrId++);
        }
        fDumAttDef->setName(bufToUse.getRawBuffer());
        decl = fDumAttDef;
    }
     else
    {
        //
        //  It does not already exist so create a new one, give it the next
        //  available unique id, and add it
        //
        decl = new (fGrammarPoolMemoryManager) DTDAttDef
        (
            bufToUse.getRawBuffer()
            , XMLAttDef::CData
            , XMLAttDef::Implied
            , fGrammarPoolMemoryManager
        );
        decl->setId(fNextAttrId++);
        decl->setExternalAttDeclaration(isReadingExternalEntity());
        parentElem.addAttDef(decl);
    }

    // Set a flag to indicate whether we are doing a dummy parse
    const bool isIgnored = (decl == fDumAttDef);

    // Space is required here, so check for PE ref, and require space
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    //
    //  Next has to be one of the attribute type strings. This tells us what
    //  is to follow.
    //
    if (fReaderMgr->skippedString(XMLUni::fgCDATAString))
    {
        decl->setType(XMLAttDef::CData);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgIDString))
    {
        if (!fReaderMgr->skippedString(XMLUni::fgRefString))
            decl->setType(XMLAttDef::ID);
        else if (!fReaderMgr->skippedChar(chLatin_S))
            decl->setType(XMLAttDef::IDRef);
        else
            decl->setType(XMLAttDef::IDRefs);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgEntitString))
    {
        if (fReaderMgr->skippedChar(chLatin_Y))
        {
            decl->setType(XMLAttDef::Entity);
        }
         else if (fReaderMgr->skippedString(XMLUni::fgIESString))
        {
            decl->setType(XMLAttDef::Entities);
        }
         else
        {
            fScanner->emitError
            (
                XMLErrs::ExpectedAttributeType
                , decl->getFullName()
                , parentElem.getFullName()
            );
            return 0;
        }
    }
     else if (fReaderMgr->skippedString(XMLUni::fgNmTokenString))
    {
        if (fReaderMgr->skippedChar(chLatin_S))
            decl->setType(XMLAttDef::NmTokens);
        else
            decl->setType(XMLAttDef::NmToken);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgNotationString))
    {
        // Check for PE ref and require space
        if (!checkForPERef(false, true))
            fScanner->emitError(XMLErrs::ExpectedWhitespace);

        decl->setType(XMLAttDef::Notation);
        if (!scanEnumeration(*decl, bufToUse, true))
            return 0;

        // Set the value as the enumeration for this decl
        decl->setEnumeration(bufToUse.getRawBuffer());
    }
     else if (fReaderMgr->skippedChar(chOpenParen))
    {
        decl->setType(XMLAttDef::Enumeration);
        if (!scanEnumeration(*decl, bufToUse, false))
            return 0;

        // Set the value as the enumeration for this decl
        decl->setEnumeration(bufToUse.getRawBuffer());
    }
     else
    {
        fScanner->emitError
        (
            XMLErrs::ExpectedAttributeType
            , decl->getFullName()
            , parentElem.getFullName()
        );
        return 0;
    }

    // Space is required here, so check for PE ref, and require space
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // And then scan for the optional default value declaration
    scanDefaultDecl(*decl);

    // If validating, then do a couple of validation constraints
    if (fScanner->getValidationScheme() == XMLScanner::Val_Always)
    {
        if (decl->getType() == XMLAttDef::ID)
        {
            if ((decl->getDefaultType() != XMLAttDef::Implied)
            &&  (decl->getDefaultType() != XMLAttDef::Required))
            {
                fScanner->getValidator()->emitError(XMLValid::BadIDAttrDefType, decl->getFullName());
            }
        }

        // if attdef is xml:space, check correct enumeration (default|preserve)
        const XMLCh fgXMLSpace[] = { chLatin_x, chLatin_m, chLatin_l, chColon, chLatin_s, chLatin_p, chLatin_a, chLatin_c, chLatin_e, chNull };

        if (XMLString::equals(decl->getFullName(),fgXMLSpace)) {
            const XMLCh fgPreserve[] = { chLatin_p, chLatin_r, chLatin_e, chLatin_s, chLatin_e, chLatin_r, chLatin_v, chLatin_e, chNull };
            const XMLCh fgDefault[] = { chLatin_d, chLatin_e, chLatin_f, chLatin_a, chLatin_u, chLatin_l, chLatin_t, chNull };
            bool ok = false;
            if (decl->getType() == XMLAttDef::Enumeration) {
                BaseRefVectorOf<XMLCh>* enumVector = XMLString::tokenizeString(decl->getEnumeration(), fMemoryManager);
                XMLSize_t size = enumVector->size();
                ok = (size == 1 &&
                     (XMLString::equals(enumVector->elementAt(0), fgDefault) ||
                      XMLString::equals(enumVector->elementAt(0), fgPreserve))) ||
                     (size == 2 &&
                     (XMLString::equals(enumVector->elementAt(0), fgDefault) &&
                      XMLString::equals(enumVector->elementAt(1), fgPreserve))) ||
                     (size == 2 &&
                     (XMLString::equals(enumVector->elementAt(1), fgDefault) &&
                      XMLString::equals(enumVector->elementAt(0), fgPreserve)));
                delete enumVector;
            }
            if (!ok)
                fScanner->getValidator()->emitError(XMLValid::IllegalXMLSpace);
        }
    }

    // If we have a doc type handler, tell it about this attdef.
    if (fDocTypeHandler)
        fDocTypeHandler->attDef(parentElem, *decl, isIgnored);
    return decl;
}